

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiVector3D __thiscall Assimp::XGLImporter::ReadVec3(XGLImporter *this)

{
  aiVector3D aVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  float *pfVar5;
  ai_real aVar6;
  uint local_2c;
  char *pcStack_28;
  int i;
  char *s;
  XGLImporter *this_local;
  undefined4 uStack_10;
  aiVector3D vec;
  
  s = (char *)this;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&this_local + 4));
  bVar2 = SkipToText(this);
  if (bVar2) {
    peVar4 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar3 = (*peVar4->_vptr_IIrrXMLReader[0xe])();
    pcStack_28 = (char *)CONCAT44(extraout_var,iVar3);
    for (local_2c = 0; (int)local_2c < 3; local_2c = local_2c + 1) {
      bVar2 = SkipSpaces<char>(&stack0xffffffffffffffd8);
      if (!bVar2) {
        LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOL, failed to parse vec3");
        break;
      }
      aVar6 = fast_atof(&stack0xffffffffffffffd8);
      pfVar5 = aiVector3t<float>::operator[]((aiVector3t<float> *)((long)&this_local + 4),local_2c);
      *pfVar5 = aVar6;
      SkipSpaces<char>(&stack0xffffffffffffffd8);
      if ((local_2c != 2) && (*pcStack_28 != ',')) {
        LogFunctions<Assimp::XGLImporter>::LogError("expected comma, failed to parse vec3");
        break;
      }
      pcStack_28 = pcStack_28 + 1;
    }
  }
  else {
    LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOF reading vec3 contents");
  }
  aVar1.z = vec.x;
  aVar1.x = (float)this_local._4_4_;
  aVar1.y = (float)uStack_10;
  return aVar1;
}

Assistant:

aiVector3D XGLImporter::ReadVec3()
{
    aiVector3D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec3 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    for(int i = 0; i < 3; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec3");
            return vec;
        }
        vec[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 2 && *s != ',') {
            LogError("expected comma, failed to parse vec3");
            return vec;
        }
        ++s;
    }

    return vec;
}